

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floating_point_stream_compression.c
# Opt level: O1

void trico_fill_code_double(uint8_t **out,uint64_t *xor1,uint64_t *xor2,uint64_t *bcode)

{
  long lVar1;
  byte *pbVar2;
  uint8_t *puVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  long lVar6;
  uint32_t k;
  long lVar7;
  uint64_t *puVar8;
  uint8_t uVar9;
  
  uVar4 = bcode[1];
  uVar5 = *bcode;
  pbVar2 = *out;
  *out = pbVar2 + 1;
  *pbVar2 = (byte)((int)uVar4 << 4) | (byte)(int)uVar5;
  lVar6 = 0;
  lVar7 = 0;
  do {
    switch(*(undefined8 *)((long)bcode + lVar6)) {
    case 1:
      puVar8 = xor1 + lVar7;
      break;
    case 2:
      goto LAB_0010ac12;
    case 3:
      goto LAB_0010ac00;
    case 4:
      goto LAB_0010abee;
    case 5:
      goto LAB_0010abdc;
    case 6:
      goto LAB_0010abca;
    case 7:
      goto LAB_0010abb8;
    case 8:
      uVar9 = *(uint8_t *)((long)xor1 + lVar6 + 7);
      puVar3 = *out;
      *out = puVar3 + 1;
      *puVar3 = uVar9;
LAB_0010abb8:
      uVar9 = *(uint8_t *)((long)xor1 + lVar6 + 6);
      puVar3 = *out;
      *out = puVar3 + 1;
      *puVar3 = uVar9;
LAB_0010abca:
      uVar9 = *(uint8_t *)((long)xor1 + lVar6 + 5);
      puVar3 = *out;
      *out = puVar3 + 1;
      *puVar3 = uVar9;
LAB_0010abdc:
      uVar9 = *(uint8_t *)((long)xor1 + lVar6 + 4);
      puVar3 = *out;
      *out = puVar3 + 1;
      *puVar3 = uVar9;
LAB_0010abee:
      uVar9 = *(uint8_t *)((long)xor1 + lVar6 + 3);
      puVar3 = *out;
      *out = puVar3 + 1;
      *puVar3 = uVar9;
LAB_0010ac00:
      uVar9 = *(uint8_t *)((long)xor1 + lVar6 + 2);
      puVar3 = *out;
      *out = puVar3 + 1;
      *puVar3 = uVar9;
LAB_0010ac12:
      puVar8 = xor1 + lVar7;
      uVar9 = *(uint8_t *)((long)xor1 + lVar6 + 1);
LAB_0010ac17:
      puVar3 = *out;
      *out = puVar3 + 1;
      *puVar3 = uVar9;
      break;
    case 9:
      puVar8 = xor2 + lVar7;
      break;
    case 10:
      lVar1 = lVar7 * 8;
      goto LAB_0010abad;
    case 0xb:
      lVar1 = lVar7 * 8;
      goto LAB_0010ab9b;
    case 0xc:
      lVar1 = lVar7 * 8;
      goto LAB_0010ab89;
    case 0xd:
      lVar1 = lVar7 * 8;
      goto LAB_0010ab77;
    case 0xe:
      lVar1 = lVar7 * 8;
      goto LAB_0010ab65;
    case 0xf:
      uVar9 = *(uint8_t *)((long)xor2 + lVar6 + 6);
      puVar3 = *out;
      *out = puVar3 + 1;
      *puVar3 = uVar9;
      lVar1 = lVar6;
LAB_0010ab65:
      uVar9 = *(uint8_t *)((long)xor2 + lVar6 + 5);
      puVar3 = *out;
      *out = puVar3 + 1;
      *puVar3 = uVar9;
LAB_0010ab77:
      uVar9 = *(uint8_t *)((long)xor2 + lVar6 + 4);
      puVar3 = *out;
      *out = puVar3 + 1;
      *puVar3 = uVar9;
LAB_0010ab89:
      uVar9 = *(uint8_t *)((long)xor2 + lVar6 + 3);
      puVar3 = *out;
      *out = puVar3 + 1;
      *puVar3 = uVar9;
LAB_0010ab9b:
      uVar9 = *(uint8_t *)((long)xor2 + lVar6 + 2);
      puVar3 = *out;
      *out = puVar3 + 1;
      *puVar3 = uVar9;
LAB_0010abad:
      puVar8 = (uint64_t *)((long)xor2 + lVar1);
      uVar9 = *(uint8_t *)((long)xor2 + lVar6 + 1);
      goto LAB_0010ac17;
    default:
      goto switchD_0010aae6_default;
    }
    uVar4 = *puVar8;
    puVar3 = *out;
    *out = puVar3 + 1;
    *puVar3 = (uint8_t)uVar4;
switchD_0010aae6_default:
    lVar7 = lVar7 + 1;
    lVar6 = lVar6 + 8;
    if (lVar6 != 8) {
      return;
    }
  } while( true );
}

Assistant:

static inline void trico_fill_code_double(uint8_t** out, uint64_t* xor1, uint64_t* xor2, uint64_t* bcode)
  {
  uint8_t bc = (uint8_t)((bcode[1] << 4) | bcode[0]);

  *(*out)++ = bc;

  for (uint32_t k = 0; k < 2; ++k)
    {
    switch (bcode[k])
      {
      case 0:
      {
      break;
      }
      case 1:
      {
      *(*out)++ = (uint8_t)(xor1[k]);
      break;
      }
      case 2:
      {
      *(*out)++ = (uint8_t)((xor1[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k]) & 0xff);
      break;
      }
      case 3:
      {
      *(*out)++ = (uint8_t)((xor1[k] >> 16));
      *(*out)++ = (uint8_t)((xor1[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k]) & 0xff);
      break;
      }
      case 4:
      {
      *(*out)++ = (uint8_t)((xor1[k] >> 24));
      *(*out)++ = (uint8_t)((xor1[k] >> 16) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k]) & 0xff);
      break;
      }
      case 5:
      {
      *(*out)++ = (uint8_t)((xor1[k] >> 32));
      *(*out)++ = (uint8_t)((xor1[k] >> 24) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 16) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k]) & 0xff);
      break;
      }
      case 6:
      {
      *(*out)++ = (uint8_t)((xor1[k] >> 40));
      *(*out)++ = (uint8_t)((xor1[k] >> 32) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 24) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 16) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k]) & 0xff);
      break;
      }
      case 7:
      {
      *(*out)++ = (uint8_t)((xor1[k] >> 48));
      *(*out)++ = (uint8_t)((xor1[k] >> 40) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 32) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 24) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 16) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k]) & 0xff);
      break;
      }
      case 8:
      {
      *(*out)++ = (uint8_t)((xor1[k] >> 56));
      *(*out)++ = (uint8_t)((xor1[k] >> 48) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 40) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 32) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 24) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 16) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k]) & 0xff);
      break;
      }
      case 9:
      {
      *(*out)++ = (uint8_t)(xor2[k]);
      break;
      }
      case 10:
      {
      *(*out)++ = (uint8_t)((xor2[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k]) & 0xff);
      break;
      }
      case 11:
      {
      *(*out)++ = (uint8_t)((xor2[k] >> 16));
      *(*out)++ = (uint8_t)((xor2[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k]) & 0xff);
      break;
      }
      case 12:
      {
      *(*out)++ = (uint8_t)((xor2[k] >> 24));
      *(*out)++ = (uint8_t)((xor2[k] >> 16) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k]) & 0xff);
      break;
      }
      case 13:
      {
      *(*out)++ = (uint8_t)((xor2[k] >> 32));
      *(*out)++ = (uint8_t)((xor2[k] >> 24) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k] >> 16) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k]) & 0xff);
      break;
      }
      case 14:
      {
      *(*out)++ = (uint8_t)((xor2[k] >> 40));
      *(*out)++ = (uint8_t)((xor2[k] >> 32) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k] >> 24) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k] >> 16) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k]) & 0xff);
      break;
      }
      case 15:
      {
      *(*out)++ = (uint8_t)((xor2[k] >> 48));
      *(*out)++ = (uint8_t)((xor2[k] >> 40) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k] >> 32) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k] >> 24) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k] >> 16) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k]) & 0xff);
      break;
      }
      }
    }
  }